

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void gnuplotio::
     deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::ModeBinary>
               (char *stream,long *arg)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  value_type local_2c;
  
  lVar1 = *arg;
  if (arg[1] != lVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      local_2c = IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
                 ::deref((IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
                          *)(lVar1 + lVar2));
      std::ostream::write(stream,(long)&local_2c);
      uVar3 = uVar3 + 1;
      lVar1 = *arg;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)(arg[1] - lVar1 >> 4));
  }
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const VecOfRange<T> &arg, PrintMode) {
    if(PrintMode::is_binfmt && arg.rvec.empty()) throw plotting_empty_container();
    for(size_t i=0; i<arg.rvec.size(); i++) {
        if(i && PrintMode::is_text) stream << " ";
        deref_and_print(stream, arg.rvec[i], PrintMode());
    }
}